

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters.c
# Opt level: O0

void ihevc_intra_pred_luma_horz
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  UWORD8 UVar1;
  short sVar2;
  int iVar3;
  WORD16 s2_predpixel;
  WORD32 two_nt;
  WORD32 col;
  WORD32 row;
  WORD32 mode_local;
  WORD32 nt_local;
  WORD32 dst_strd_local;
  UWORD8 *pu1_dst_local;
  WORD32 src_strd_local;
  UWORD8 *pu1_ref_local;
  
  iVar3 = nt * 2;
  if (nt == 0x20) {
    for (row = 0; row < 0x20; row = row + 1) {
      for (col = 0; col < 0x20; col = col + 1) {
        pu1_dst[row * dst_strd + col] = pu1_ref[(iVar3 + -1) - row];
      }
    }
  }
  else {
    for (col = 0; col < nt; col = col + 1) {
      sVar2 = (ushort)pu1_ref[iVar3 + -1] +
              (short)((int)((uint)pu1_ref[iVar3 + 1 + col] - (uint)pu1_ref[iVar3]) >> 1);
      if (sVar2 < 0x100) {
        if (sVar2 < 0) {
          sVar2 = 0;
        }
        UVar1 = (UWORD8)sVar2;
      }
      else {
        UVar1 = 0xff;
      }
      pu1_dst[col] = UVar1;
    }
    for (row = 1; row < nt; row = row + 1) {
      for (col = 0; col < nt; col = col + 1) {
        pu1_dst[row * dst_strd + col] = pu1_ref[(iVar3 + -1) - row];
      }
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_horz(UWORD8 *pu1_ref,
                                WORD32 src_strd,
                                UWORD8 *pu1_dst,
                                WORD32 dst_strd,
                                WORD32 nt,
                                WORD32 mode)
{

    WORD32 row, col;
    WORD32 two_nt;
    WORD16 s2_predpixel;
    UNUSED(mode);
    UNUSED(src_strd);
    two_nt = 2 * nt;

    if(nt == 32)
    {
        for(row = 0; row < nt; row++)
            for(col = 0; col < nt; col++)
                pu1_dst[(row * dst_strd) + col] = pu1_ref[two_nt - 1 - row];
    }
    else
    {
        /*Filtering done for the 1st row */
        for(col = 0; col < nt; col++)
        {
            s2_predpixel = pu1_ref[two_nt - 1]
                            + ((pu1_ref[two_nt + 1 + col] - pu1_ref[two_nt]) >> 1);
            pu1_dst[col] = CLIP_U8(s2_predpixel);
        }

        /* Replication to next rows*/
        for(row = 1; row < nt; row++)
            for(col = 0; col < nt; col++)
                pu1_dst[(row * dst_strd) + col] = pu1_ref[two_nt - 1 - row];
    }
}